

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O0

Expression * __thiscall
wasm::TranslateToFuzzReader::makeUnary(TranslateToFuzzReader *this,Type type)

{
  bool bVar1;
  BasicType BVar2;
  UnaryOp UVar3;
  Index IVar4;
  FeatureOptions<wasm::UnaryOp> *pFVar5;
  Type local_480;
  FeatureSet local_474;
  FeatureSet local_470;
  FeatureSet local_46c;
  FeatureOptions<wasm::UnaryOp> local_468;
  UnaryArgs local_438;
  Type local_428;
  UnaryArgs local_420;
  Type local_410;
  UnaryArgs local_408;
  Type local_3f8;
  UnaryArgs local_3f0;
  Type local_3e0;
  UnaryArgs local_3d8;
  Type local_3c8;
  UnaryArgs local_3c0;
  Type local_3b0;
  UnaryArgs local_3a8;
  Type local_398;
  UnaryArgs local_390;
  Type local_380;
  UnaryArgs local_378;
  Type local_368;
  UnaryArgs local_360;
  Type local_350;
  UnaryArgs local_348;
  Type local_338;
  UnaryArgs local_330;
  Type local_320;
  UnaryArgs local_318;
  Type local_308;
  UnaryArgs local_300;
  FeatureSet local_2f0;
  FeatureSet local_2ec;
  FeatureOptions<wasm::UnaryOp> local_2e8;
  UnaryOp local_2ac;
  Type TStack_2a8;
  UnaryOp op_6;
  UnaryArgs local_2a0;
  FeatureSet local_290;
  FeatureSet local_28c;
  FeatureOptions<wasm::UnaryOp> local_288;
  UnaryOp local_254;
  Type TStack_250;
  UnaryOp op_5;
  UnaryArgs local_248;
  Type local_238;
  UnaryArgs local_230;
  FeatureSet local_220;
  FeatureSet local_21c;
  FeatureOptions<wasm::UnaryOp> local_218;
  UnaryOp local_1dc;
  Type TStack_1d8;
  UnaryOp op_4;
  UnaryArgs local_1d0;
  FeatureSet local_1bc;
  FeatureOptions<wasm::UnaryOp> local_1b8;
  UnaryOp local_17c;
  Type TStack_178;
  UnaryOp op_3;
  UnaryArgs local_170;
  FeatureSet local_160;
  FeatureSet local_15c;
  FeatureOptions<wasm::UnaryOp> local_158;
  UnaryOp local_11c;
  Type TStack_118;
  UnaryOp op_2;
  UnaryArgs local_110;
  FeatureSet local_100;
  FeatureSet local_fc;
  FeatureOptions<wasm::UnaryOp> local_f8;
  UnaryOp local_c4;
  Type TStack_c0;
  UnaryOp op_1;
  UnaryArgs local_b8;
  Type local_a8;
  UnaryArgs local_a0;
  FeatureSet local_90 [5];
  FeatureSet local_7c;
  FeatureOptions<wasm::UnaryOp> local_78;
  UnaryOp local_3c;
  TranslateToFuzzReader *pTStack_38;
  UnaryOp op;
  Type local_30;
  Type singleConcreteType;
  TranslateToFuzzReader *this_local;
  Type type_local;
  
  this_local = (TranslateToFuzzReader *)type.id;
  bVar1 = Type::isTuple((Type *)&this_local);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!type.isTuple()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                  ,0xedb,"Expression *wasm::TranslateToFuzzReader::makeUnary(Type)");
  }
  bVar1 = Type::isRef((Type *)&this_local);
  if (bVar1) {
    singleConcreteType.id = (uintptr_t)this_local;
    type_local.id = (uintptr_t)makeTrivial(this,(Type)this_local);
  }
  else {
    BVar2 = Type::getBasic((Type *)&this_local);
    switch(BVar2) {
    case none:
    case unreachable:
      ::wasm::handle_unreachable
                ("unexpected type",
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                 ,0xfca);
    case i32:
      local_30 = getSingleConcreteType(this);
      bVar1 = Type::isRef(&local_30);
      if (bVar1) {
        pTStack_38 = this_local;
        type_local.id = (uintptr_t)makeTrivial(this,(Type)this_local);
      }
      else {
        BVar2 = Type::getBasic(&local_30);
        switch(BVar2) {
        case none:
        case unreachable:
          ::wasm::handle_unreachable
                    ("unexpected type",
                     "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                     ,0xf16);
        case i32:
          local_78.options._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
          local_78.options._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          local_78.options._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          local_78.options._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
          local_78.options._M_t._M_impl._0_8_ = 0;
          local_78.options._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          local_78.options._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
          Random::FeatureOptions<wasm::UnaryOp>::FeatureOptions(&local_78);
          FeatureSet::FeatureSet(&local_7c,0);
          pFVar5 = Random::FeatureOptions<wasm::UnaryOp>::
                   add<wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp>
                             (&local_78,local_7c,EqZInt32,ClzInt32,CtzInt32,PopcntInt32);
          FeatureSet::FeatureSet(local_90,0x20);
          pFVar5 = Random::FeatureOptions<wasm::UnaryOp>::add<wasm::UnaryOp>
                             (pFVar5,local_90[0],ExtendS8Int32,ExtendS16Int32);
          UVar3 = pick<wasm::UnaryOp>(this,pFVar5);
          Random::FeatureOptions<wasm::UnaryOp>::~FeatureOptions(&local_78);
          local_a0.a = UVar3;
          local_3c = UVar3;
          Type::Type(&local_a8,i32);
          local_a0.b = make(this,local_a8);
          type_local.id = (uintptr_t)buildUnary(this,&local_a0);
          break;
        case i64:
          local_b8.a = pick<wasm::UnaryOp,wasm::UnaryOp>(this,EqZInt64,WrapInt64);
          Type::Type(&stack0xffffffffffffff40,i64);
          local_b8.b = make(this,TStack_c0);
          type_local.id = (uintptr_t)buildUnary(this,&local_b8);
          break;
        case f32:
          local_f8.options._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
          local_f8.options._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          local_f8.options._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          local_f8.options._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
          local_f8.options._M_t._M_impl._0_8_ = 0;
          local_f8.options._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          local_f8.options._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
          Random::FeatureOptions<wasm::UnaryOp>::FeatureOptions(&local_f8);
          FeatureSet::FeatureSet(&local_fc,0);
          pFVar5 = Random::FeatureOptions<wasm::UnaryOp>::add<wasm::UnaryOp,wasm::UnaryOp>
                             (&local_f8,local_fc,TruncSFloat32ToInt32,TruncUFloat32ToInt32,
                              ReinterpretFloat32);
          FeatureSet::FeatureSet(&local_100,4);
          pFVar5 = Random::FeatureOptions<wasm::UnaryOp>::add<wasm::UnaryOp>
                             (pFVar5,local_100,TruncSatSFloat32ToInt32,TruncSatUFloat32ToInt32);
          UVar3 = pick<wasm::UnaryOp>(this,pFVar5);
          Random::FeatureOptions<wasm::UnaryOp>::~FeatureOptions(&local_f8);
          local_110.a = UVar3;
          local_c4 = UVar3;
          Type::Type(&stack0xfffffffffffffee8,f32);
          local_110.b = make(this,TStack_118);
          type_local.id = (uintptr_t)buildUnary(this,&local_110);
          break;
        case f64:
          local_158.options._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
          local_158.options._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          local_158.options._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          local_158.options._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
          local_158.options._M_t._M_impl._0_8_ = 0;
          local_158.options._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          local_158.options._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
          Random::FeatureOptions<wasm::UnaryOp>::FeatureOptions(&local_158);
          FeatureSet::FeatureSet(&local_15c,0);
          pFVar5 = Random::FeatureOptions<wasm::UnaryOp>::add<wasm::UnaryOp>
                             (&local_158,local_15c,TruncSFloat64ToInt32,TruncUFloat64ToInt32);
          FeatureSet::FeatureSet(&local_160,4);
          pFVar5 = Random::FeatureOptions<wasm::UnaryOp>::add<wasm::UnaryOp>
                             (pFVar5,local_160,TruncSatSFloat64ToInt32,TruncSatUFloat64ToInt32);
          UVar3 = pick<wasm::UnaryOp>(this,pFVar5);
          Random::FeatureOptions<wasm::UnaryOp>::~FeatureOptions(&local_158);
          local_170.a = UVar3;
          local_11c = UVar3;
          Type::Type(&stack0xfffffffffffffe88,f64);
          local_170.b = make(this,TStack_178);
          type_local.id = (uintptr_t)buildUnary(this,&local_170);
          break;
        case v128:
          bVar1 = FeatureSet::hasSIMD(&this->wasm->features);
          if (!bVar1) {
            __assert_fail("wasm.features.hasSIMD()",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                          ,0xf07,"Expression *wasm::TranslateToFuzzReader::makeUnary(Type)");
          }
          local_1b8.options._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
          local_1b8.options._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          local_1b8.options._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          local_1b8.options._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
          local_1b8.options._M_t._M_impl._0_8_ = 0;
          local_1b8.options._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          local_1b8.options._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
          Random::FeatureOptions<wasm::UnaryOp>::FeatureOptions(&local_1b8);
          FeatureSet::FeatureSet(&local_1bc,8);
          pFVar5 = Random::FeatureOptions<wasm::UnaryOp>::
                   add<wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp>
                             (&local_1b8,local_1bc,AnyTrueVec128,AllTrueVecI8x16,AllTrueVecI16x8,
                              AllTrueVecI32x4,AllTrueVecI64x2,BitmaskVecI8x16,BitmaskVecI16x8,
                              BitmaskVecI32x4,BitmaskVecI64x2);
          UVar3 = pick<wasm::UnaryOp>(this,pFVar5);
          Random::FeatureOptions<wasm::UnaryOp>::~FeatureOptions(&local_1b8);
          local_1d0.a = UVar3;
          local_17c = UVar3;
          Type::Type(&stack0xfffffffffffffe28,v128);
          local_1d0.b = make(this,TStack_1d8);
          type_local.id = (uintptr_t)buildUnary(this,&local_1d0);
          break;
        default:
          ::wasm::handle_unreachable
                    ("invalid type",
                     "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                     ,0xf18);
        }
      }
      break;
    case i64:
      IVar4 = upTo(this,4);
      switch(IVar4) {
      case 0:
        local_218.options._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
        local_218.options._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_218.options._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_218.options._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
        local_218.options._M_t._M_impl._0_8_ = 0;
        local_218.options._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_218.options._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
        Random::FeatureOptions<wasm::UnaryOp>::FeatureOptions(&local_218);
        FeatureSet::FeatureSet(&local_21c,0);
        pFVar5 = Random::FeatureOptions<wasm::UnaryOp>::add<wasm::UnaryOp,wasm::UnaryOp>
                           (&local_218,local_21c,ClzInt64,CtzInt64,PopcntInt64);
        FeatureSet::FeatureSet(&local_220,0x20);
        pFVar5 = Random::FeatureOptions<wasm::UnaryOp>::add<wasm::UnaryOp,wasm::UnaryOp>
                           (pFVar5,local_220,ExtendS8Int64,ExtendS16Int64,ExtendS32Int64);
        UVar3 = pick<wasm::UnaryOp>(this,pFVar5);
        Random::FeatureOptions<wasm::UnaryOp>::~FeatureOptions(&local_218);
        local_230.a = UVar3;
        local_1dc = UVar3;
        Type::Type(&local_238,i64);
        local_230.b = make(this,local_238);
        type_local.id = (uintptr_t)buildUnary(this,&local_230);
        break;
      case 1:
        local_248.a = pick<wasm::UnaryOp,wasm::UnaryOp>(this,ExtendSInt32,ExtendUInt32);
        Type::Type(&stack0xfffffffffffffdb0,i32);
        local_248.b = make(this,TStack_250);
        type_local.id = (uintptr_t)buildUnary(this,&local_248);
        break;
      case 2:
        local_288.options._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
        local_288.options._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_288.options._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_288.options._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
        local_288.options._M_t._M_impl._0_8_ = 0;
        local_288.options._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_288.options._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
        Random::FeatureOptions<wasm::UnaryOp>::FeatureOptions(&local_288);
        FeatureSet::FeatureSet(&local_28c,0);
        pFVar5 = Random::FeatureOptions<wasm::UnaryOp>::add<wasm::UnaryOp>
                           (&local_288,local_28c,TruncSFloat32ToInt64,TruncUFloat32ToInt64);
        FeatureSet::FeatureSet(&local_290,4);
        pFVar5 = Random::FeatureOptions<wasm::UnaryOp>::add<wasm::UnaryOp>
                           (pFVar5,local_290,TruncSatSFloat32ToInt64,TruncSatUFloat32ToInt64);
        UVar3 = pick<wasm::UnaryOp>(this,pFVar5);
        Random::FeatureOptions<wasm::UnaryOp>::~FeatureOptions(&local_288);
        local_2a0.a = UVar3;
        local_254 = UVar3;
        Type::Type(&stack0xfffffffffffffd58,f32);
        local_2a0.b = make(this,TStack_2a8);
        type_local.id = (uintptr_t)buildUnary(this,&local_2a0);
        break;
      case 3:
        local_2e8.options._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
        local_2e8.options._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_2e8.options._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_2e8.options._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
        local_2e8.options._M_t._M_impl._0_8_ = 0;
        local_2e8.options._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_2e8.options._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
        Random::FeatureOptions<wasm::UnaryOp>::FeatureOptions(&local_2e8);
        FeatureSet::FeatureSet(&local_2ec,0);
        pFVar5 = Random::FeatureOptions<wasm::UnaryOp>::add<wasm::UnaryOp,wasm::UnaryOp>
                           (&local_2e8,local_2ec,TruncSFloat64ToInt64,TruncUFloat64ToInt64,
                            ReinterpretFloat64);
        FeatureSet::FeatureSet(&local_2f0,4);
        pFVar5 = Random::FeatureOptions<wasm::UnaryOp>::add<wasm::UnaryOp>
                           (pFVar5,local_2f0,TruncSatSFloat64ToInt64,TruncSatUFloat64ToInt64);
        UVar3 = pick<wasm::UnaryOp>(this,pFVar5);
        Random::FeatureOptions<wasm::UnaryOp>::~FeatureOptions(&local_2e8);
        local_300.a = UVar3;
        local_2ac = UVar3;
        Type::Type(&local_308,f64);
        local_300.b = make(this,local_308);
        type_local.id = (uintptr_t)buildUnary(this,&local_300);
        break;
      default:
        ::wasm::handle_unreachable
                  ("invalid value",
                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                   ,0xf3e);
      }
      break;
    case f32:
      IVar4 = upTo(this,4);
      switch(IVar4) {
      case 0:
        local_318.a = pick<wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp>
                                (this,NegFloat32,AbsFloat32,CeilFloat32,FloorFloat32,TruncFloat32,
                                 NearestFloat32,SqrtFloat32);
        Type::Type(&local_320,f32);
        local_318.b = make(this,local_320);
        type_local.id = (uintptr_t)buildUnary(this,&local_318);
        break;
      case 1:
        local_330.a = pick<wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp>
                                (this,ConvertUInt32ToFloat32,ConvertSInt32ToFloat32,ReinterpretInt32
                                );
        Type::Type(&local_338,i32);
        local_330.b = make(this,local_338);
        type_local.id = (uintptr_t)buildUnary(this,&local_330);
        break;
      case 2:
        local_348.a = pick<wasm::UnaryOp,wasm::UnaryOp>
                                (this,ConvertUInt64ToFloat32,ConvertSInt64ToFloat32);
        Type::Type(&local_350,i64);
        local_348.b = make(this,local_350);
        type_local.id = (uintptr_t)buildUnary(this,&local_348);
        break;
      case 3:
        local_360.a = DemoteFloat64;
        Type::Type(&local_368,f64);
        local_360.b = make(this,local_368);
        type_local.id = (uintptr_t)buildUnary(this,&local_360);
        break;
      default:
        ::wasm::handle_unreachable
                  ("invalid value",
                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                   ,0xf57);
      }
      break;
    case f64:
      IVar4 = upTo(this,4);
      switch(IVar4) {
      case 0:
        local_378.a = pick<wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp>
                                (this,NegFloat64,AbsFloat64,CeilFloat64,FloorFloat64,TruncFloat64,
                                 NearestFloat64,SqrtFloat64);
        Type::Type(&local_380,f64);
        local_378.b = make(this,local_380);
        type_local.id = (uintptr_t)buildUnary(this,&local_378);
        break;
      case 1:
        local_390.a = pick<wasm::UnaryOp,wasm::UnaryOp>
                                (this,ConvertUInt32ToFloat64,ConvertSInt32ToFloat64);
        Type::Type(&local_398,i32);
        local_390.b = make(this,local_398);
        type_local.id = (uintptr_t)buildUnary(this,&local_390);
        break;
      case 2:
        local_3a8.a = pick<wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp>
                                (this,ConvertUInt64ToFloat64,ConvertSInt64ToFloat64,ReinterpretInt64
                                );
        Type::Type(&local_3b0,i64);
        local_3a8.b = make(this,local_3b0);
        type_local.id = (uintptr_t)buildUnary(this,&local_3a8);
        break;
      case 3:
        local_3c0.a = PromoteFloat32;
        Type::Type(&local_3c8,f32);
        local_3c0.b = make(this,local_3c8);
        type_local.id = (uintptr_t)buildUnary(this,&local_3c0);
        break;
      default:
        ::wasm::handle_unreachable
                  ("invalid value",
                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                   ,0xf70);
      }
      break;
    case v128:
      bVar1 = FeatureSet::hasSIMD(&this->wasm->features);
      if (!bVar1) {
        __assert_fail("wasm.features.hasSIMD()",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                      ,0xf73,"Expression *wasm::TranslateToFuzzReader::makeUnary(Type)");
      }
      IVar4 = upTo(this,5);
      switch(IVar4) {
      case 0:
        local_3d8.a = pick<wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp>
                                (this,SplatVecI8x16,SplatVecI16x8,SplatVecI32x4);
        Type::Type(&local_3e0,i32);
        local_3d8.b = make(this,local_3e0);
        type_local.id = (uintptr_t)buildUnary(this,&local_3d8);
        break;
      case 1:
        local_3f0.a = SplatVecI64x2;
        Type::Type(&local_3f8,i64);
        local_3f0.b = make(this,local_3f8);
        type_local.id = (uintptr_t)buildUnary(this,&local_3f0);
        break;
      case 2:
        local_408.a = SplatVecF32x4;
        Type::Type(&local_410,f32);
        local_408.b = make(this,local_410);
        type_local.id = (uintptr_t)buildUnary(this,&local_408);
        break;
      case 3:
        local_420.a = SplatVecF64x2;
        Type::Type(&local_428,f64);
        local_420.b = make(this,local_428);
        type_local.id = (uintptr_t)buildUnary(this,&local_420);
        break;
      case 4:
        local_468.options._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
        local_468.options._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_468.options._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_468.options._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
        local_468.options._M_t._M_impl._0_8_ = 0;
        local_468.options._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_468.options._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
        Random::FeatureOptions<wasm::UnaryOp>::FeatureOptions(&local_468);
        FeatureSet::FeatureSet(&local_46c,8);
        pFVar5 = Random::FeatureOptions<wasm::UnaryOp>::
                 add<wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp>
                           (&local_468,local_46c,NotVec128,AbsVecI8x16,AbsVecI16x8,AbsVecI32x4,
                            AbsVecI64x2,PopcntVecI8x16,NegVecI8x16,NegVecI16x8,NegVecI32x4,
                            NegVecI64x2,AbsVecF32x4,NegVecF32x4,SqrtVecF32x4,CeilVecF32x4,
                            FloorVecF32x4,TruncVecF32x4,NearestVecF32x4,AbsVecF64x2,NegVecF64x2,
                            SqrtVecF64x2,CeilVecF64x2,FloorVecF64x2,TruncVecF64x2,NearestVecF64x2,
                            ExtAddPairwiseSVecI8x16ToI16x8,ExtAddPairwiseUVecI8x16ToI16x8,
                            ExtAddPairwiseSVecI16x8ToI32x4,ExtAddPairwiseUVecI16x8ToI32x4,
                            TruncSatSVecF32x4ToVecI32x4,TruncSatUVecF32x4ToVecI32x4,
                            ConvertSVecI32x4ToVecF32x4,ConvertUVecI32x4ToVecF32x4,
                            ExtendLowSVecI8x16ToVecI16x8,ExtendHighSVecI8x16ToVecI16x8,
                            ExtendLowUVecI8x16ToVecI16x8,ExtendHighUVecI8x16ToVecI16x8,
                            ExtendLowSVecI16x8ToVecI32x4,ExtendHighSVecI16x8ToVecI32x4,
                            ExtendLowUVecI16x8ToVecI32x4,ExtendHighUVecI16x8ToVecI32x4,
                            ExtendLowSVecI32x4ToVecI64x2,ExtendHighSVecI32x4ToVecI64x2,
                            ExtendLowUVecI32x4ToVecI64x2,ExtendHighUVecI32x4ToVecI64x2,
                            ConvertLowSVecI32x4ToVecF64x2,ConvertLowUVecI32x4ToVecF64x2,
                            TruncSatZeroSVecF64x2ToVecI32x4,TruncSatZeroUVecF64x2ToVecI32x4,
                            DemoteZeroVecF64x2ToVecF32x4,PromoteLowVecF32x4ToVecF64x2);
        FeatureSet::FeatureSet(&local_470,0x1000);
        pFVar5 = Random::FeatureOptions<wasm::UnaryOp>::
                 add<wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp>
                           (pFVar5,local_470,RelaxedTruncSVecF32x4ToVecI32x4,
                            RelaxedTruncUVecF32x4ToVecI32x4,RelaxedTruncZeroSVecF64x2ToVecI32x4,
                            RelaxedTruncZeroUVecF64x2ToVecI32x4);
        FeatureSet::FeatureSet(&local_474,0x40000);
        pFVar5 = Random::FeatureOptions<wasm::UnaryOp>::
                 add<wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp>
                           (pFVar5,local_474,AbsVecF16x8,NegVecF16x8,SqrtVecF16x8,CeilVecF16x8,
                            FloorVecF16x8,TruncVecF16x8,NearestVecF16x8,TruncSatSVecF16x8ToVecI16x8,
                            TruncSatUVecF16x8ToVecI16x8,ConvertSVecI16x8ToVecF16x8,
                            ConvertUVecI16x8ToVecF16x8);
        local_438.a = pick<wasm::UnaryOp>(this,pFVar5);
        Type::Type(&local_480,v128);
        local_438.b = make(this,local_480);
        type_local.id = (uintptr_t)buildUnary(this,&local_438);
        Random::FeatureOptions<wasm::UnaryOp>::~FeatureOptions(&local_468);
        break;
      default:
        ::wasm::handle_unreachable
                  ("invalid value",
                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                   ,0xfc6);
      }
      break;
    default:
      ::wasm::handle_unreachable
                ("invalid type",
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                 ,0xfcc);
    }
  }
  return (Expression *)type_local.id;
}

Assistant:

Expression* TranslateToFuzzReader::makeUnary(Type type) {
  assert(!type.isTuple());
  // There are no unary ops for reference types.
  // TODO: not quite true if you count struct.new and array.new.
  if (type.isRef()) {
    return makeTrivial(type);
  }
  switch (type.getBasic()) {
    case Type::i32: {
      auto singleConcreteType = getSingleConcreteType();
      if (singleConcreteType.isRef()) {
        // TODO: Do something more interesting here.
        return makeTrivial(type);
      }
      switch (singleConcreteType.getBasic()) {
        case Type::i32: {
          auto op = pick(
            FeatureOptions<UnaryOp>()
              .add(FeatureSet::MVP, EqZInt32, ClzInt32, CtzInt32, PopcntInt32)
              .add(FeatureSet::SignExt, ExtendS8Int32, ExtendS16Int32));
          return buildUnary({op, make(Type::i32)});
        }
        case Type::i64:
          return buildUnary({pick(EqZInt64, WrapInt64), make(Type::i64)});
        case Type::f32: {
          auto op = pick(FeatureOptions<UnaryOp>()
                           .add(FeatureSet::MVP,
                                TruncSFloat32ToInt32,
                                TruncUFloat32ToInt32,
                                ReinterpretFloat32)
                           .add(FeatureSet::TruncSat,
                                TruncSatSFloat32ToInt32,
                                TruncSatUFloat32ToInt32));
          return buildUnary({op, make(Type::f32)});
        }
        case Type::f64: {
          auto op = pick(
            FeatureOptions<UnaryOp>()
              .add(FeatureSet::MVP, TruncSFloat64ToInt32, TruncUFloat64ToInt32)
              .add(FeatureSet::TruncSat,
                   TruncSatSFloat64ToInt32,
                   TruncSatUFloat64ToInt32));
          return buildUnary({op, make(Type::f64)});
        }
        case Type::v128: {
          assert(wasm.features.hasSIMD());
          auto op = pick(FeatureOptions<UnaryOp>().add(FeatureSet::SIMD,
                                                       AnyTrueVec128,
                                                       AllTrueVecI8x16,
                                                       AllTrueVecI16x8,
                                                       AllTrueVecI32x4,
                                                       AllTrueVecI64x2,
                                                       BitmaskVecI8x16,
                                                       BitmaskVecI16x8,
                                                       BitmaskVecI32x4,
                                                       BitmaskVecI64x2));
          return buildUnary({op, make(Type::v128)});
        }
        case Type::none:
        case Type::unreachable:
          WASM_UNREACHABLE("unexpected type");
      }
      WASM_UNREACHABLE("invalid type");
    }
    case Type::i64: {
      switch (upTo(4)) {
        case 0: {
          auto op =
            pick(FeatureOptions<UnaryOp>()
                   .add(FeatureSet::MVP, ClzInt64, CtzInt64, PopcntInt64)
                   .add(FeatureSet::SignExt,
                        ExtendS8Int64,
                        ExtendS16Int64,
                        ExtendS32Int64));
          return buildUnary({op, make(Type::i64)});
        }
        case 1:
          return buildUnary(
            {pick(ExtendSInt32, ExtendUInt32), make(Type::i32)});
        case 2: {
          auto op = pick(
            FeatureOptions<UnaryOp>()
              .add(FeatureSet::MVP, TruncSFloat32ToInt64, TruncUFloat32ToInt64)
              .add(FeatureSet::TruncSat,
                   TruncSatSFloat32ToInt64,
                   TruncSatUFloat32ToInt64));
          return buildUnary({op, make(Type::f32)});
        }
        case 3: {
          auto op = pick(FeatureOptions<UnaryOp>()
                           .add(FeatureSet::MVP,
                                TruncSFloat64ToInt64,
                                TruncUFloat64ToInt64,
                                ReinterpretFloat64)
                           .add(FeatureSet::TruncSat,
                                TruncSatSFloat64ToInt64,
                                TruncSatUFloat64ToInt64));
          return buildUnary({op, make(Type::f64)});
        }
      }
      WASM_UNREACHABLE("invalid value");
    }
    case Type::f32: {
      switch (upTo(4)) {
        case 0:
          return buildUnary({pick(NegFloat32,
                                  AbsFloat32,
                                  CeilFloat32,
                                  FloorFloat32,
                                  TruncFloat32,
                                  NearestFloat32,
                                  SqrtFloat32),
                             make(Type::f32)});
        case 1:
          return buildUnary({pick(ConvertUInt32ToFloat32,
                                  ConvertSInt32ToFloat32,
                                  ReinterpretInt32),
                             make(Type::i32)});
        case 2:
          return buildUnary(
            {pick(ConvertUInt64ToFloat32, ConvertSInt64ToFloat32),
             make(Type::i64)});
        case 3:
          return buildUnary({DemoteFloat64, make(Type::f64)});
      }
      WASM_UNREACHABLE("invalid value");
    }
    case Type::f64: {
      switch (upTo(4)) {
        case 0:
          return buildUnary({pick(NegFloat64,
                                  AbsFloat64,
                                  CeilFloat64,
                                  FloorFloat64,
                                  TruncFloat64,
                                  NearestFloat64,
                                  SqrtFloat64),
                             make(Type::f64)});
        case 1:
          return buildUnary(
            {pick(ConvertUInt32ToFloat64, ConvertSInt32ToFloat64),
             make(Type::i32)});
        case 2:
          return buildUnary({pick(ConvertUInt64ToFloat64,
                                  ConvertSInt64ToFloat64,
                                  ReinterpretInt64),
                             make(Type::i64)});
        case 3:
          return buildUnary({PromoteFloat32, make(Type::f32)});
      }
      WASM_UNREACHABLE("invalid value");
    }
    case Type::v128: {
      assert(wasm.features.hasSIMD());
      switch (upTo(5)) {
        case 0:
          return buildUnary({pick(SplatVecI8x16, SplatVecI16x8, SplatVecI32x4),
                             make(Type::i32)});
        case 1:
          return buildUnary({SplatVecI64x2, make(Type::i64)});
        case 2:
          return buildUnary({SplatVecF32x4, make(Type::f32)});
        case 3:
          return buildUnary({SplatVecF64x2, make(Type::f64)});
        case 4:
          return buildUnary({pick(FeatureOptions<UnaryOp>()
                                    .add(FeatureSet::SIMD,
                                         NotVec128,
                                         AbsVecI8x16,
                                         AbsVecI16x8,
                                         AbsVecI32x4,
                                         AbsVecI64x2,
                                         PopcntVecI8x16,
                                         NegVecI8x16,
                                         NegVecI16x8,
                                         NegVecI32x4,
                                         NegVecI64x2,
                                         AbsVecF32x4,
                                         NegVecF32x4,
                                         SqrtVecF32x4,
                                         CeilVecF32x4,
                                         FloorVecF32x4,
                                         TruncVecF32x4,
                                         NearestVecF32x4,
                                         AbsVecF64x2,
                                         NegVecF64x2,
                                         SqrtVecF64x2,
                                         CeilVecF64x2,
                                         FloorVecF64x2,
                                         TruncVecF64x2,
                                         NearestVecF64x2,
                                         ExtAddPairwiseSVecI8x16ToI16x8,
                                         ExtAddPairwiseUVecI8x16ToI16x8,
                                         ExtAddPairwiseSVecI16x8ToI32x4,
                                         ExtAddPairwiseUVecI16x8ToI32x4,
                                         TruncSatSVecF32x4ToVecI32x4,
                                         TruncSatUVecF32x4ToVecI32x4,
                                         ConvertSVecI32x4ToVecF32x4,
                                         ConvertUVecI32x4ToVecF32x4,
                                         ExtendLowSVecI8x16ToVecI16x8,
                                         ExtendHighSVecI8x16ToVecI16x8,
                                         ExtendLowUVecI8x16ToVecI16x8,
                                         ExtendHighUVecI8x16ToVecI16x8,
                                         ExtendLowSVecI16x8ToVecI32x4,
                                         ExtendHighSVecI16x8ToVecI32x4,
                                         ExtendLowUVecI16x8ToVecI32x4,
                                         ExtendHighUVecI16x8ToVecI32x4,
                                         ExtendLowSVecI32x4ToVecI64x2,
                                         ExtendHighSVecI32x4ToVecI64x2,
                                         ExtendLowUVecI32x4ToVecI64x2,
                                         ExtendHighUVecI32x4ToVecI64x2,
                                         ConvertLowSVecI32x4ToVecF64x2,
                                         ConvertLowUVecI32x4ToVecF64x2,
                                         TruncSatZeroSVecF64x2ToVecI32x4,
                                         TruncSatZeroUVecF64x2ToVecI32x4,
                                         DemoteZeroVecF64x2ToVecF32x4,
                                         PromoteLowVecF32x4ToVecF64x2)
                                    .add(FeatureSet::RelaxedSIMD,
                                         RelaxedTruncSVecF32x4ToVecI32x4,
                                         RelaxedTruncUVecF32x4ToVecI32x4,
                                         RelaxedTruncZeroSVecF64x2ToVecI32x4,
                                         RelaxedTruncZeroUVecF64x2ToVecI32x4)
                                    .add(FeatureSet::FP16,
                                         AbsVecF16x8,
                                         NegVecF16x8,
                                         SqrtVecF16x8,
                                         CeilVecF16x8,
                                         FloorVecF16x8,
                                         TruncVecF16x8,
                                         NearestVecF16x8,
                                         TruncSatSVecF16x8ToVecI16x8,
                                         TruncSatUVecF16x8ToVecI16x8,
                                         ConvertSVecI16x8ToVecF16x8,
                                         ConvertUVecI16x8ToVecF16x8)),
                             make(Type::v128)});
      }
      WASM_UNREACHABLE("invalid value");
    }
    case Type::none:
    case Type::unreachable:
      WASM_UNREACHABLE("unexpected type");
  }
  WASM_UNREACHABLE("invalid type");
}